

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O1

void recff_table_isarray(jit_State *J,RecordFFData *rd)

{
  TRef TVar1;
  int iVar2;
  TRef TVar3;
  TRef TVar4;
  
  if ((*J->base & 0x1f000000) == 0xb000000) {
    TVar1 = lj_ir_call(J,IRCALL_lj_tab_isarray);
    iVar2 = lj_tab_isarray((GCtab *)(rd->argv->u64 & 0x7fffffffffff));
    TVar3 = lj_ir_kint(J,0);
    TVar4 = 0x2007ffd;
    if (iVar2 == 0) {
      TVar4 = 0x1007ffe;
    }
    (J->fold).ins.field_0.ot = (ushort)(iVar2 != 0) << 8 | 0x893;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar1;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar3;
    lj_opt_fold(J);
    *J->base = TVar4;
  }
  return;
}

Assistant:

static void LJ_FASTCALL recff_table_isarray(jit_State *J, RecordFFData *rd)
{
  TRef src = J->base[0];
  if (LJ_LIKELY(tref_istab(src))) {
    TRef trres = lj_ir_call(J, IRCALL_lj_tab_isarray, src);
    GCtab *t = tabV(&rd->argv[0]);
    int isarr = lj_tab_isarray(t);
    TRef tr0 = lj_ir_kint(J, 0);
    emitir(isarr ? IRTGI(IR_NE) : IRTGI(IR_EQ), trres, tr0);
    J->base[0] = isarr ? TREF_TRUE : TREF_FALSE;
  }  /* else: Interpreter will throw. */
}